

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neverbleed.c
# Opt level: O0

int neverbleed_setuidgid(neverbleed_t *nb,char *user,int change_socket_ownership)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  int local_50 [2];
  size_t ret;
  expbuf_t buf;
  st_neverbleed_thread_data_t *thdata;
  int change_socket_ownership_local;
  char *user_local;
  neverbleed_t *nb_local;
  
  buf.capacity = (size_t)get_thread_data(nb);
  memset(&ret,0,0x20);
  expbuf_push_str((expbuf_t *)&ret,"setuidgid");
  expbuf_push_str((expbuf_t *)&ret,user);
  expbuf_push_num((expbuf_t *)&ret,(long)change_socket_ownership);
  iVar1 = expbuf_write((expbuf_t *)&ret,*(int *)(buf.capacity + 4));
  if (iVar1 != 0) {
    piVar2 = __errno_location();
    pcVar3 = "connection closed by daemon";
    if (*piVar2 != 0) {
      pcVar3 = "write error";
    }
    dief(pcVar3);
  }
  expbuf_dispose((expbuf_t *)&ret);
  iVar1 = expbuf_read((expbuf_t *)&ret,*(int *)(buf.capacity + 4));
  if (iVar1 != 0) {
    piVar2 = __errno_location();
    pcVar3 = "connection closed by daemon";
    if (*piVar2 != 0) {
      pcVar3 = "read error";
    }
    dief(pcVar3);
  }
  iVar1 = expbuf_shift_num((expbuf_t *)&ret,(size_t *)local_50);
  if (iVar1 != 0) {
    piVar2 = __errno_location();
    *piVar2 = 0;
    dief("failed to parse response");
  }
  expbuf_dispose((expbuf_t *)&ret);
  return local_50[0];
}

Assistant:

int neverbleed_setuidgid(neverbleed_t *nb, const char *user, int change_socket_ownership)
{
    struct st_neverbleed_thread_data_t *thdata = get_thread_data(nb);
    struct expbuf_t buf = {NULL};
    size_t ret;

    expbuf_push_str(&buf, "setuidgid");
    expbuf_push_str(&buf, user);
    expbuf_push_num(&buf, change_socket_ownership);
    if (expbuf_write(&buf, thdata->fd) != 0)
        dief(errno != 0 ? "write error" : "connection closed by daemon");
    expbuf_dispose(&buf);

    if (expbuf_read(&buf, thdata->fd) != 0)
        dief(errno != 0 ? "read error" : "connection closed by daemon");
    if (expbuf_shift_num(&buf, &ret) != 0) {
        errno = 0;
        dief("failed to parse response");
    }
    expbuf_dispose(&buf);

    return (int)ret;
}